

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O3

int Fra_ClausProcessClausesCut(Clu_Man_t *p,Fra_Sml_t *pSimMan,Dar_Cut_t *pCut,int *pScores)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  undefined1 *puVar5;
  ulong uVar6;
  long lVar7;
  long *plVar8;
  long lVar9;
  uint Matrix [32];
  uint *pSims [16];
  uint local_138 [31];
  undefined1 auStack_bc [4];
  long local_b8 [17];
  
  uVar3 = *(uint *)&pCut->field_0x4;
  if (0x5fffffff < uVar3 + 0xc0000000) {
    __assert_fail("pCut->nLeaves > 1 && pCut->nLeaves < 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClaus.c"
                  ,0xd1,
                  "int Fra_ClausProcessClausesCut(Clu_Man_t *, Fra_Sml_t *, Dar_Cut_t *, int *)");
  }
  iVar4 = pSimMan->nWordsTotal;
  iVar1 = p->nSimWordsPref;
  uVar2 = iVar4 - iVar1;
  if ((uVar2 & 7) == 0) {
    uVar6 = 0;
    do {
      local_b8[uVar6] =
           (long)&pSimMan[1].pAig + (long)pCut->pLeaves[uVar6] * (long)iVar4 * 4 + (long)iVar1 * 4;
      uVar6 = uVar6 + 1;
    } while (uVar3 >> 0x1d != uVar6);
    pScores[0xc] = 0;
    pScores[0xd] = 0;
    pScores[0xe] = 0;
    pScores[0xf] = 0;
    pScores[8] = 0;
    pScores[9] = 0;
    pScores[10] = 0;
    pScores[0xb] = 0;
    pScores[4] = 0;
    pScores[5] = 0;
    pScores[6] = 0;
    pScores[7] = 0;
    pScores[0] = 0;
    pScores[1] = 0;
    pScores[2] = 0;
    pScores[3] = 0;
    uVar2 = (int)uVar2 >> 3;
    if (0 < (int)uVar2) {
      uVar6 = 0;
      do {
        local_138[0x1c] = 0;
        local_138[0x1d] = 0;
        stack0xffffffffffffff40 = 0;
        local_138[0x18] = 0;
        local_138[0x19] = 0;
        local_138[0x1a] = 0;
        local_138[0x1b] = 0;
        local_138[0x14] = 0;
        local_138[0x15] = 0;
        local_138[0x16] = 0;
        local_138[0x17] = 0;
        local_138[0x10] = 0;
        local_138[0x11] = 0;
        local_138[0x12] = 0;
        local_138[0x13] = 0;
        local_138[0xc] = 0;
        local_138[0xd] = 0;
        local_138[0xe] = 0;
        local_138[0xf] = 0;
        local_138[8] = 0;
        local_138[9] = 0;
        local_138[10] = 0;
        local_138[0xb] = 0;
        local_138[4] = 0;
        local_138[5] = 0;
        local_138[6] = 0;
        local_138[7] = 0;
        local_138[0] = 0;
        local_138[1] = 0;
        local_138[2] = 0;
        local_138[3] = 0;
        uVar3 = *(uint *)&pCut->field_0x4;
        puVar5 = auStack_bc;
        lVar7 = 0;
        do {
          if (0x1fffffff < uVar3) {
            lVar9 = 0;
            plVar8 = local_b8;
            do {
              *(undefined4 *)(puVar5 + lVar9 * 4) =
                   *(undefined4 *)(uVar6 * 0x20 + *plVar8 + lVar7 * 4);
              lVar9 = lVar9 + -1;
              plVar8 = plVar8 + 1;
            } while (-lVar9 != (ulong)(uVar3 >> 0x1d));
          }
          lVar7 = lVar7 + 1;
          puVar5 = puVar5 + -0x10;
        } while (lVar7 != 8);
        transpose32a(local_138);
        lVar7 = 0;
        do {
          uVar3 = local_138[lVar7];
          iVar4 = 8;
          do {
            pScores[uVar3 & 0xf] = pScores[uVar3 & 0xf] + 1;
            uVar3 = uVar3 >> 4;
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x20);
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar2);
    }
    return ~-(uint)(pScores[0xf] == 0) & 0x8000 | ~-(uint)(pScores[0xb] == 0) & 0x800 |
           ~-(uint)(pScores[7] == 0) & 0x80 | ~-(uint)(pScores[3] == 0) & 8 |
           ~-(uint)(pScores[0xd] == 0) & 0x2000 | ~-(uint)(pScores[9] == 0) & 0x200 |
           ~-(uint)(pScores[5] == 0) & 0x20 | ~-(uint)(pScores[1] == 0) & 2 |
           ~-(uint)(pScores[0xe] == 0) & 0x4000 | ~-(uint)(pScores[10] == 0) & 0x400 |
           ~-(uint)(pScores[6] == 0) & 0x40 | ~-(uint)(pScores[2] == 0) & 4 |
           ~-(uint)(pScores[0xc] == 0) & 0x1000 | ~-(uint)(pScores[8] == 0) & 0x100 |
           ~-(uint)(pScores[4] == 0) & 0x10 | ~-(uint)(*pScores == 0) & 1;
  }
  __assert_fail("nWordsForSim % 8 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClaus.c"
                ,0xd2,"int Fra_ClausProcessClausesCut(Clu_Man_t *, Fra_Sml_t *, Dar_Cut_t *, int *)"
               );
}

Assistant:

int Fra_ClausProcessClausesCut( Clu_Man_t * p, Fra_Sml_t * pSimMan, Dar_Cut_t * pCut, int * pScores )
{
    unsigned Matrix[32];
    unsigned * pSims[16], uWord;
    int nSeries, i, k, j;
    int nWordsForSim = pSimMan->nWordsTotal - p->nSimWordsPref;
    // compute parameters
    assert( pCut->nLeaves > 1 && pCut->nLeaves < 5 );
    assert( nWordsForSim % 8 == 0 );
    // get parameters
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        pSims[i] = Fra_ObjSim( pSimMan, pCut->pLeaves[i] ) + p->nSimWordsPref;
    // add combinational patterns
    memset( pScores, 0, sizeof(int) * 16 );
    nSeries = nWordsForSim / 8;
    for ( i = 0; i < nSeries; i++ )
    {
        memset( Matrix, 0, sizeof(unsigned) * 32 );
        for ( k = 0; k < 8; k++ )
            for ( j = 0; j < (int)pCut->nLeaves; j++ )
                Matrix[31-(k*4+j)] = pSims[j][i*8+k];
        transpose32a( Matrix );
        for ( k = 0; k < 32; k++ )
            for ( j = 0, uWord = Matrix[k]; j < 8; j++, uWord >>= 4 )
                pScores[uWord & 0xF]++;
    }
    // collect patterns
    uWord = 0;
    for ( i = 0; i < 16; i++ )
        if ( pScores[i] )
            uWord |= (1 << i);
//    Extra_PrintBinary( stdout, &uWord, 16 ); printf( "\n" );
    return (int)uWord;
}